

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

bool tchecker::ta::has_non_constant_reset(system_t *system)

{
  has_clock_resets_t hVar1;
  const_iterator __r;
  typed_statement_t *stmt;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar2;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  rVar2 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  for (__r._M_current =
            (shared_ptr<tchecker::system::edge_t> *)rVar2._begin.super_const_iterator._M_current;
      (const_iterator)__r._M_current !=
      rVar2._end.super_const_iterator._M_current.super_const_iterator;
      __r._M_current = __r._M_current + 1) {
    std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::edge_t,void>
              ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               &(__r._M_current)->
                super___shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>);
    stmt = system_t::statement(system,*(edge_id_t *)(local_40 + 4));
    hVar1 = has_clock_resets(stmt);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    if (((uint3)hVar1 & 0x10100) != 0) break;
  }
  return (const_iterator)__r._M_current !=
         rVar2._end.super_const_iterator._M_current.super_const_iterator;
}

Assistant:

bool has_non_constant_reset(tchecker::ta::system_t const & system)
{
  // Check edge statements
  for (tchecker::system::edge_const_shared_ptr_t const & edge : system.edges()) {
    tchecker::has_clock_resets_t statement_has_clock_resets = tchecker::has_clock_resets(system.statement(edge->id()));
    if (statement_has_clock_resets.clock || statement_has_clock_resets.sum)
      return true;
  }
  return false;
}